

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CartesianProductTest.cpp
# Opt level: O2

void __thiscall isSameTopology::test_method(isSameTopology *this)

{
  shared_count sStack_798;
  char *local_790;
  char *local_788;
  undefined **local_780;
  undefined1 local_778;
  undefined8 *local_770;
  char **local_768;
  CartesianProduct cp2;
  char *local_6a0;
  char *local_698;
  char *local_690;
  char *local_688;
  undefined1 *local_680;
  undefined1 *local_678;
  char *local_670;
  char *local_668;
  char *local_660;
  char *local_658;
  undefined1 *local_650;
  undefined1 *local_648;
  char *local_640;
  char *local_638;
  char *local_630;
  char *local_628;
  undefined1 *local_620;
  undefined1 *local_618;
  char *local_610;
  char *local_608;
  char *local_600;
  char *local_5f8;
  undefined1 *local_5f0;
  undefined1 *local_5e8;
  char *local_5e0;
  char *local_5d8;
  char *local_5d0;
  char *local_5c8;
  undefined1 *local_5c0;
  undefined1 *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  char *local_598;
  undefined1 *local_590;
  undefined1 *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  char *local_568;
  undefined1 *local_560;
  undefined1 *local_558;
  char *local_550;
  char *local_548;
  S2 s2;
  RealSpace R9;
  CartesianProduct cp;
  SO3<mnf::ExpMapMatrix> so3M;
  RealSpace R3;
  RealSpace R9b;
  CartesianProduct cp2b;
  SO3<mnf::ExpMapQuaternion> so3Q;
  CartesianProduct cpb;
  
  mnf::RealSpace::RealSpace(&R9,9);
  mnf::RealSpace::RealSpace(&R9b,9);
  mnf::RealSpace::RealSpace(&R3,3);
  mnf::S2::S2(&s2);
  mnf::SO3<mnf::ExpMapMatrix>::SO3(&so3M);
  mnf::SO3<mnf::ExpMapQuaternion>::SO3(&so3Q);
  mnf::CartesianProduct::CartesianProduct(&cp,&so3M.super_Manifold,(Manifold *)&R9);
  mnf::CartesianProduct::CartesianProduct(&cp2,(Manifold *)&cp,(Manifold *)&s2);
  mnf::CartesianProduct::CartesianProduct(&cpb,&so3M.super_Manifold,(Manifold *)&R9b);
  mnf::CartesianProduct::CartesianProduct(&cp2b,(Manifold *)&cp,(Manifold *)&s2);
  local_550 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
  ;
  local_548 = "";
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_550,0x236);
  mnf::CartesianProduct::isSameTopology((Manifold *)&cp2);
  sStack_798.pi_ = (sp_counted_base *)0x0;
  local_790 = "!cp2.isSameTopology(R9)";
  local_788 = "";
  local_778 = 0;
  local_780 = &PTR__lazy_ostream_00150be0;
  local_770 = &boost::unit_test::lazy_ostream::inst;
  local_570 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
  ;
  local_568 = "";
  local_768 = &local_790;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_798);
  local_580 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
  ;
  local_578 = "";
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  local_588 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_580,0x237);
  mnf::CartesianProduct::isSameTopology((Manifold *)&cp2);
  sStack_798.pi_ = (sp_counted_base *)0x0;
  local_790 = "!cp2.isSameTopology(R3)";
  local_788 = "";
  local_778 = 0;
  local_780 = &PTR__lazy_ostream_00150be0;
  local_770 = &boost::unit_test::lazy_ostream::inst;
  local_5a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
  ;
  local_598 = "";
  local_768 = &local_790;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_798);
  local_5b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
  ;
  local_5a8 = "";
  local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_5b0,0x238);
  mnf::CartesianProduct::isSameTopology((Manifold *)&cp2);
  sStack_798.pi_ = (sp_counted_base *)0x0;
  local_790 = "!cp2.isSameTopology(s2)";
  local_788 = "";
  local_778 = 0;
  local_780 = &PTR__lazy_ostream_00150be0;
  local_770 = &boost::unit_test::lazy_ostream::inst;
  local_5d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
  ;
  local_5c8 = "";
  local_768 = &local_790;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_798);
  local_5e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
  ;
  local_5d8 = "";
  local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_5e0,0x239);
  mnf::CartesianProduct::isSameTopology((Manifold *)&cp2);
  sStack_798.pi_ = (sp_counted_base *)0x0;
  local_790 = "!cp2.isSameTopology(so3M)";
  local_788 = "";
  local_778 = 0;
  local_780 = &PTR__lazy_ostream_00150be0;
  local_770 = &boost::unit_test::lazy_ostream::inst;
  local_600 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
  ;
  local_5f8 = "";
  local_768 = &local_790;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_798);
  local_610 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
  ;
  local_608 = "";
  local_620 = &boost::unit_test::basic_cstring<char_const>::null;
  local_618 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_610,0x23a);
  mnf::CartesianProduct::isSameTopology((Manifold *)&cp2);
  sStack_798.pi_ = (sp_counted_base *)0x0;
  local_790 = "!cp2.isSameTopology(so3Q)";
  local_788 = "";
  local_778 = 0;
  local_780 = &PTR__lazy_ostream_00150be0;
  local_770 = &boost::unit_test::lazy_ostream::inst;
  local_630 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
  ;
  local_628 = "";
  local_768 = &local_790;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_798);
  local_640 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
  ;
  local_638 = "";
  local_650 = &boost::unit_test::basic_cstring<char_const>::null;
  local_648 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_640,0x23b);
  mnf::CartesianProduct::isSameTopology((Manifold *)&cp2);
  sStack_798.pi_ = (sp_counted_base *)0x0;
  local_790 = "!cp2.isSameTopology(cp)";
  local_788 = "";
  local_778 = 0;
  local_780 = &PTR__lazy_ostream_00150be0;
  local_770 = &boost::unit_test::lazy_ostream::inst;
  local_660 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
  ;
  local_658 = "";
  local_768 = &local_790;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_798);
  local_670 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
  ;
  local_668 = "";
  local_680 = &boost::unit_test::basic_cstring<char_const>::null;
  local_678 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_670,0x23c);
  mnf::CartesianProduct::isSameTopology((Manifold *)&cp2);
  sStack_798.pi_ = (sp_counted_base *)0x0;
  local_790 = "cp2.isSameTopology(cp2)";
  local_788 = "";
  local_778 = 0;
  local_780 = &PTR__lazy_ostream_00150be0;
  local_770 = &boost::unit_test::lazy_ostream::inst;
  local_690 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
  ;
  local_688 = "";
  local_768 = &local_790;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_798);
  local_6a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
  ;
  local_698 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_6a0,0x23d);
  mnf::CartesianProduct::isSameTopology((Manifold *)&cp2);
  sStack_798.pi_ = (sp_counted_base *)0x0;
  local_790 = "cp2.isSameTopology(cp2b)";
  local_788 = "";
  local_778 = 0;
  local_780 = &PTR__lazy_ostream_00150be0;
  local_770 = &boost::unit_test::lazy_ostream::inst;
  local_768 = &local_790;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_798);
  mnf::CartesianProduct::~CartesianProduct(&cp2b);
  mnf::CartesianProduct::~CartesianProduct(&cpb);
  mnf::CartesianProduct::~CartesianProduct(&cp2);
  mnf::CartesianProduct::~CartesianProduct(&cp);
  mnf::SO3<mnf::ExpMapQuaternion>::~SO3(&so3Q);
  mnf::SO3<mnf::ExpMapMatrix>::~SO3(&so3M);
  mnf::Manifold::~Manifold((Manifold *)&s2);
  mnf::RealSpace::~RealSpace(&R3);
  mnf::RealSpace::~RealSpace(&R9b);
  mnf::RealSpace::~RealSpace(&R9);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(isSameTopology)
{
  RealSpace R9(9);
  RealSpace R9b(9);
  RealSpace R3(3);
  S2 s2;
  SO3<ExpMapMatrix> so3M;
  SO3<ExpMapQuaternion> so3Q;
  CartesianProduct cp(so3M, R9);
  CartesianProduct cp2(cp, s2);
  CartesianProduct cpb(so3M, R9b);
  CartesianProduct cp2b(cp, s2);

  BOOST_CHECK(!cp2.isSameTopology(R9));
  BOOST_CHECK(!cp2.isSameTopology(R3));
  BOOST_CHECK(!cp2.isSameTopology(s2));
  BOOST_CHECK(!cp2.isSameTopology(so3M));
  BOOST_CHECK(!cp2.isSameTopology(so3Q));
  BOOST_CHECK(!cp2.isSameTopology(cp));
  BOOST_CHECK(cp2.isSameTopology(cp2));
  BOOST_CHECK(cp2.isSameTopology(cp2b));
}